

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O1

bool SaveDeviceMemory(path *fname,size_t start,size_t length)

{
  pointer pcVar1;
  FILE *__s;
  size_t sVar2;
  long *local_48 [2];
  long local_38 [2];
  
  __s = (FILE *)SJ_fopen(fname,"wb");
  if (__s == (FILE *)0x0) {
    pcVar1 = (fname->_M_pathname)._M_dataplus._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,pcVar1,pcVar1 + (fname->_M_pathname)._M_string_length);
    Error("opening file for write",(char *)local_48[0],FATAL);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  sVar2 = fwrite(Device->Memory + start,1,length,__s);
  fclose(__s);
  return sVar2 == length;
}

Assistant:

bool SaveDeviceMemory(const std::filesystem::path & fname, const size_t start, const size_t length) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) Error("opening file for write", fname.string().c_str(), FATAL);
	bool res = SaveDeviceMemory(ff, start, length);
	fclose(ff);
	return res;
}